

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void __thiscall
util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[15],int&>
          (exception *this,char (*args) [20],CylHead *args_1,char (*args_2) [15],int *args_3)

{
  int *in_R9;
  string local_30;
  
  make_string<char_const(&)[20],CylHead&,char_const(&)[15],int&>
            (&local_30,(util *)args,(char (*) [20])args_1,(CylHead *)args_2,(char (*) [15])args_3,
             in_R9);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_001dac18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}